

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

Move io::parseMove(string *input,Board *pos)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  reference pMVar8;
  undefined4 *puVar9;
  int local_8c;
  __normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_> local_88
  ;
  iterator __end2;
  iterator __begin2;
  vector<board::Move,_std::allocator<board::Move>_> local_68;
  vector<board::Move,_std::allocator<board::Move>_> *local_50;
  vector<board::Move,_std::allocator<board::Move>_> *__range2;
  MoveList movelist;
  int promoted;
  int to;
  int from;
  Board *pos_local;
  string *input_local;
  Move move;
  
  uVar6 = std::__cxx11::string::length();
  if (3 < uVar6) {
    pcVar7 = (char *)std::__cxx11::string::at((ulong)input);
    cVar1 = *pcVar7;
    pcVar7 = (char *)std::__cxx11::string::at((ulong)input);
    iVar3 = board::Board::FR2SQ(cVar1 + -0x61,*pcVar7 + -0x31);
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)input);
    cVar1 = *pcVar7;
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)input);
    iVar4 = board::Board::FR2SQ(cVar1 + -0x61,*pcVar7 + -0x31);
    movelist.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    search::movegen::generateAll((MoveList *)&__range2,pos,false);
    search::MoveList::getMoves(&local_68,(MoveList *)&__range2);
    local_50 = &local_68;
    __end2 = std::vector<board::Move,_std::allocator<board::Move>_>::begin(local_50);
    local_88._M_current =
         (Move *)std::vector<board::Move,_std::allocator<board::Move>_>::end(local_50);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&local_88), bVar2) {
      pMVar8 = __gnu_cxx::
               __normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>
               ::operator*(&__end2);
      input_local = *(string **)pMVar8;
      iVar5 = board::Move::getValue((Move *)&input_local);
      iVar5 = board::Move::FROMSQ(iVar5);
      if (iVar5 == iVar3) {
        iVar5 = board::Move::getValue((Move *)&input_local);
        iVar5 = board::Move::TOSQ(iVar5);
        if (iVar5 == iVar4) {
          iVar5 = board::Move::getValue((Move *)&input_local);
          movelist.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = board::Move::PROMOTED(iVar5);
          if (movelist.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
            local_8c = 1;
            goto LAB_00109054;
          }
          uVar6 = std::__cxx11::string::length();
          if (4 < uVar6) {
            if ((board::Board::PIECE_NO_TEAM
                 [movelist.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 4) &&
               (pcVar7 = (char *)std::__cxx11::string::at((ulong)input), *pcVar7 == 'r')) {
              local_8c = 1;
              goto LAB_00109054;
            }
            if ((board::Board::PIECE_NO_TEAM
                 [movelist.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 3) &&
               (pcVar7 = (char *)std::__cxx11::string::at((ulong)input), *pcVar7 == 'b')) {
              local_8c = 1;
              goto LAB_00109054;
            }
            if ((board::Board::PIECE_NO_TEAM
                 [movelist.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 5) &&
               (pcVar7 = (char *)std::__cxx11::string::at((ulong)input), *pcVar7 == 'q')) {
              local_8c = 1;
              goto LAB_00109054;
            }
            if ((board::Board::PIECE_NO_TEAM
                 [movelist.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 2) &&
               (pcVar7 = (char *)std::__cxx11::string::at((ulong)input), *pcVar7 == 'n')) {
              local_8c = 1;
              goto LAB_00109054;
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>::
      operator++(&__end2);
    }
    local_8c = 2;
LAB_00109054:
    std::vector<board::Move,_std::allocator<board::Move>_>::~vector(&local_68);
    if (local_8c == 2) {
      local_8c = 0;
    }
    search::MoveList::~MoveList((MoveList *)&__range2);
    if (local_8c != 0) {
      return (Move)input_local;
    }
  }
  puVar9 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar9 = 0;
  __cxa_throw(puVar9,&int::typeinfo,0);
}

Assistant:

board::Move io::parseMove(const std::string& input, board::Board& pos)
{
    if (input.length() > 3) {
        int from = board::Board::FR2SQ(input.at(0) - 'a', input.at(1) - '1');
        int to = board::Board::FR2SQ(input[2] - 'a', input[3] - '1');
        int promoted = 0;
        search::MoveList movelist = search::movegen::generateAll(pos, false);
        for (board::Move move : movelist.getMoves()) {
            if (board::Move::FROMSQ(move.getValue()) == from && board::Move::TOSQ(move.getValue()) == to) {
                promoted = board::Move::PROMOTED(move.getValue());
                if (promoted == board::EMPTY) {
                    return move;
                }
                if (input.length() > 4) {
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WR && input.at(4) == 'r') {
                        return move;
                    }
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WB && input.at(4) == 'b') {
                        return move;
                    }
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WQ && input.at(4) == 'q') {
                        return move;
                    }
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WN && input.at(4) == 'n') {
                        return move;
                    }
                }
            }
        }
    }
    throw 0;
}